

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptTypedNumber.cpp
# Opt level: O0

Var Js::JavascriptTypedNumber<long>::ToVar(long value,ScriptContext *scriptContext)

{
  ScriptContext *value_00;
  bool bVar1;
  Recycler *pRVar2;
  JavascriptTypedNumber<long> *this;
  JavascriptLibrary *this_00;
  StaticType *type;
  TrackAllocData local_50;
  JavascriptTypedNumber<long> *number;
  ScriptContext *scriptContext_local;
  long value_local;
  
  number = (JavascriptTypedNumber<long> *)scriptContext;
  scriptContext_local = (ScriptContext *)value;
  bVar1 = TaggedInt::IsOverflow(value);
  if (bVar1) {
    pRVar2 = ScriptContext::GetRecycler((ScriptContext *)number);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptTypedNumber.cpp"
               ,0x11);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_50);
    this = (JavascriptTypedNumber<long> *)new<Memory::Recycler>(0x18,pRVar2,0xa38830);
    value_00 = scriptContext_local;
    this_00 = ScriptContext::GetLibrary((ScriptContext *)number);
    type = JavascriptLibrary::GetInt64TypeStatic(this_00);
    JavascriptTypedNumber(this,(long)value_00,type);
    value_local = (long)this;
  }
  else {
    value_local = (long)TaggedInt::ToVarUnchecked((int)scriptContext_local);
  }
  return (Var)value_local;
}

Assistant:

Var JavascriptTypedNumber<__int64>::ToVar(__int64 value, ScriptContext* scriptContext)
    {
        if (!TaggedInt::IsOverflow(value))
        {
            return TaggedInt::ToVarUnchecked((int)value);
        }
        JavascriptTypedNumber<__int64>* number = RecyclerNewLeaf(scriptContext->GetRecycler(), JavascriptInt64Number, value,
            scriptContext->GetLibrary()->GetInt64TypeStatic());
        return number;
    }